

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O1

int rtr_mgr_remove_group(rtr_mgr_config *config,uint preference)

{
  pthread_rwlock_t *__rwlock;
  uint uVar1;
  long lVar2;
  tommy_list ptVar3;
  void *ptr;
  rtr_mgr_group *prVar4;
  int iVar5;
  tommy_node_struct *ptVar6;
  tommy_node *head;
  tommy_list ptVar7;
  char *frmt;
  tommy_node_struct *ptVar8;
  tommy_list ptVar9;
  tommy_list ptVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &config->mutex;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  uVar1 = config->len;
  if (uVar1 == 1) {
    frmt = "RTR_MGR: Cannot remove last remaining group!";
  }
  else {
    ptVar6 = (tommy_node_struct *)config->groups;
    ptVar3 = ptVar6->next;
    if (ptVar3 == (tommy_list)0x0) {
      bVar12 = true;
      ptVar7 = (tommy_list)0x0;
    }
    else {
      ptVar8 = ptVar3;
      ptVar9 = (tommy_list)0x0;
      do {
        ptVar7 = ptVar8;
        if (*(byte *)(*(long *)((long)ptVar8->data + 0x20) + 0xc) != preference) {
          ptVar7 = ptVar9;
        }
        ptVar8 = ptVar8->next;
        bVar12 = ptVar7 == (tommy_list)0x0;
      } while ((ptVar8 != (tommy_node_struct *)0x0) && (ptVar9 = ptVar7, ptVar7 == (tommy_list)0x0))
      ;
    }
    if (!bVar12) {
      ptr = ptVar7->data;
      prVar4 = *(rtr_mgr_group **)((long)ptr + 0x20);
      ptVar9 = ptVar7->next;
      ptVar10 = ptVar9;
      if (ptVar9 == (tommy_list)0x0) {
        ptVar10 = ptVar3;
      }
      ptVar10->prev = ptVar7->prev;
      if (ptVar3 != ptVar7) {
        ptVar6 = ptVar7->prev;
      }
      ptVar6->next = ptVar9;
      config->len = uVar1 - 1;
      lrtr_dbg("RTR_MGR: Group with preference %d successfully removed!",preference);
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      if (prVar4->status != RTR_MGR_CLOSED) {
        if (prVar4->sockets_len != 0) {
          uVar11 = 0;
          do {
            rtr_stop(prVar4->sockets[uVar11]);
            tr_free(prVar4->sockets[uVar11]->tr_socket);
            uVar11 = uVar11 + 1;
          } while (uVar11 < prVar4->sockets_len);
        }
        set_status(config,prVar4,RTR_MGR_CLOSED,(rtr_socket *)0x0);
      }
      prVar4 = *(rtr_mgr_group **)((long)config->groups->list->data + 0x20);
      if (prVar4->status == RTR_MGR_CLOSED) {
        rtr_mgr_start_sockets(prVar4);
      }
      lrtr_free(*(void **)((long)ptr + 0x20));
      lrtr_free(ptr);
      iVar5 = 0;
      goto LAB_001066aa;
    }
    frmt = "RTR_MGR: The group that should be removed does not exist!";
  }
  lrtr_dbg(frmt);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  iVar5 = -1;
LAB_001066aa:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_remove_group(struct rtr_mgr_config *config, unsigned int preference)
{
	pthread_rwlock_wrlock(&config->mutex);
	tommy_node *remove_node = NULL;
	tommy_node *node = tommy_list_head(&config->groups->list);
	struct rtr_mgr_group_node *group_node;
	struct rtr_mgr_group *remove_group;

	if (config->len == 1) {
		MGR_DBG1("Cannot remove last remaining group!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	// Find the node of the group we want to remove
	while (node && !remove_node) {
		group_node = node->data;
		if (group_node->group->preference == preference)
			remove_node = node;
		node = node->next;
	}

	if (!remove_node) {
		MGR_DBG1("The group that should be removed does not exist!");
		pthread_rwlock_unlock(&config->mutex);
		return RTR_ERROR;
	}

	group_node = remove_node->data;
	remove_group = group_node->group;
	tommy_list_remove_existing(&config->groups->list, remove_node);
	config->len--;
	MGR_DBG("Group with preference %d successfully removed!", preference);
	// tommy_list_sort(&config->groups->list, &rtr_mgr_config_cmp);
	pthread_rwlock_unlock(&config->mutex);

	// If group isn't closed, make it so!
	if (remove_group->status != RTR_MGR_CLOSED) {
		for (unsigned int j = 0; j < remove_group->sockets_len; j++) {
			rtr_stop(remove_group->sockets[j]);
			tr_free(remove_group->sockets[j]->tr_socket);
		}
		set_status(config, remove_group, RTR_MGR_CLOSED, NULL);
	}

	struct rtr_mgr_group *best_group = rtr_mgr_get_first_group(config);

	if (best_group->status == RTR_MGR_CLOSED)
		rtr_mgr_start_sockets(best_group);

	lrtr_free(group_node->group);
	lrtr_free(group_node);
	return RTR_SUCCESS;
}